

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Importer.cpp
# Opt level: O2

aiReturn __thiscall Assimp::Importer::UnregisterLoader(Importer *this,BaseImporter *pImp)

{
  BaseImporter **ppBVar1;
  __normal_iterator<Assimp::BaseImporter_**,_std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>_>
  __position;
  Logger *pLVar2;
  aiReturn aVar3;
  BaseImporter *local_20;
  
  if (pImp == (BaseImporter *)0x0) {
    aVar3 = aiReturn_SUCCESS;
  }
  else {
    local_20 = pImp;
    __position = std::
                 __find_if<__gnu_cxx::__normal_iterator<Assimp::BaseImporter**,std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>>,__gnu_cxx::__ops::_Iter_equals_val<Assimp::BaseImporter*const>>
                           ((this->pimpl->mImporter).
                            super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (this->pimpl->mImporter).
                            super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish,&local_20);
    ppBVar1 = (this->pimpl->mImporter).
              super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current == ppBVar1) {
      pLVar2 = DefaultLogger::get();
      Logger::warn(pLVar2,"Unable to remove custom importer: I can\'t find you ...");
    }
    else {
      std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::erase
                (&this->pimpl->mImporter,(const_iterator)__position._M_current);
      pLVar2 = DefaultLogger::get();
      Logger::info(pLVar2,"Unregistering custom importer: ");
    }
    aVar3 = -(uint)(__position._M_current == ppBVar1);
  }
  return aVar3;
}

Assistant:

aiReturn Importer::UnregisterLoader(BaseImporter* pImp)
{
    if(!pImp) {
        // unregistering a NULL importer is no problem for us ... really!
        return AI_SUCCESS;
    }

    ASSIMP_BEGIN_EXCEPTION_REGION();
    std::vector<BaseImporter*>::iterator it = std::find(pimpl->mImporter.begin(),
        pimpl->mImporter.end(),pImp);

    if (it != pimpl->mImporter.end())   {
        pimpl->mImporter.erase(it);
        ASSIMP_LOG_INFO("Unregistering custom importer: ");
        return AI_SUCCESS;
    }
    ASSIMP_LOG_WARN("Unable to remove custom importer: I can't find you ...");
    ASSIMP_END_EXCEPTION_REGION(aiReturn);
    return AI_FAILURE;
}